

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

Function * __thiscall LinkedObjectFile::get_function_at_label(LinkedObjectFile *this,int label_id)

{
  Function *func;
  reference pvVar1;
  reference pvVar2;
  pointer pFVar3;
  
  pvVar1 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)label_id);
  pvVar2 = std::
           vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
           ::at(&this->functions_by_seg,(long)pvVar1->target_segment);
  pFVar3 = (pvVar2->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pFVar3 == (pvVar2->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x5c,"Function &LinkedObjectFile::get_function_at_label(int)");
    }
    if (pFVar3->start_word * 4 + 4 == pvVar1->offset) break;
    pFVar3 = pFVar3 + 1;
  }
  return pFVar3;
}

Assistant:

Function& LinkedObjectFile::get_function_at_label(int label_id) {
  auto& label = labels.at(label_id);
  for (auto& func : functions_by_seg.at(label.target_segment)) {
    // + 4 to skip past type tag to the first word, which is were the label points.
    if (func.start_word * 4 + 4 == label.offset) {
      return func;
    }
  }

  assert(false);
  return functions_by_seg.front().front(); // to avoid error
}